

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

bool __thiscall
helics::tcp::TcpComms::establishBrokerConnection
          (TcpComms *this,shared_ptr<gmlc::networking::AsioContextManager> *ioctx,
          shared_ptr<gmlc::networking::TcpConnection> *brokerConnection)

{
  string_view string2;
  string_view string1;
  anon_class_16_2_e88081c1 callback;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  bool bVar1;
  int iVar2;
  __int_type_conflict _Var3;
  element_type *peVar4;
  pair<helics::route_id,_helics::ActionMessage> *ppVar5;
  size_t __n;
  size_t __n_00;
  __shared_ptr *in_RDX;
  void *__buf;
  long in_RDI;
  exception *e;
  exception *e_3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> mess;
  endpoint brk;
  vector<char,_std::allocator<char>_> rx;
  system_error *error;
  ActionMessage m;
  bool connectionEstablished;
  milliseconds popTimeout;
  milliseconds cumulativeSleep;
  system_error *e_2;
  int retries;
  system_error *e_1;
  SocketFactory sf;
  anon_class_16_2_8f9776d2 terminate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff890;
  memory_order in_stack_fffffffffffff894;
  ActionMessage *in_stack_fffffffffffff898;
  int in_stack_fffffffffffff8a0;
  undefined2 in_stack_fffffffffffff8a4;
  undefined1 in_stack_fffffffffffff8a6;
  strong_ordering in_stack_fffffffffffff8a7;
  undefined4 in_stack_fffffffffffff8a8;
  ConnectionStatus in_stack_fffffffffffff8ac;
  ActionMessage *in_stack_fffffffffffff8b0;
  ActionMessage *in_stack_fffffffffffff8b8;
  ActionMessage *in_stack_fffffffffffff8c8;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  TcpConnection *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  SocketFactory *in_stack_fffffffffffff8f0;
  CommsInterface *in_stack_fffffffffffff900;
  CommsInterface *this_00;
  size_t in_stack_fffffffffffff908;
  allocator<char> *paVar6;
  char *in_stack_fffffffffffff910;
  string *in_stack_fffffffffffff998;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff9b0;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_fffffffffffff9b8;
  __unspec local_60a;
  type local_609;
  int local_5f4;
  duration<long,std::ratio<1l,1l>> local_5f0 [8];
  string *in_stack_fffffffffffffa18;
  string *in_stack_fffffffffffffa20;
  io_context *in_stack_fffffffffffffa28;
  SocketFactory *in_stack_fffffffffffffa30;
  milliseconds in_stack_fffffffffffffa38;
  undefined4 local_4e0;
  int local_4d8;
  allocator<char> local_3c9;
  undefined1 local_3c8 [168];
  __sv_type local_320;
  undefined4 local_30c;
  byte local_251;
  size_type local_250;
  undefined1 local_248 [276];
  int local_134;
  duration<long,std::ratio<1l,1000l>> local_130 [232];
  undefined1 local_48 [40];
  __shared_ptr *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  if (*(int *)(in_RDI + 0x410) < 0) {
    iVar2 = getDefaultBrokerPort((TcpComms *)0x3d34dd);
    *(int *)(in_RDI + 0x410) = iVar2;
  }
  if ((*(byte *)(in_RDI + 0x41c) & 1) == 0) {
    memset(local_48,0,0x18);
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  }
  else {
    gmlc::networking::SocketFactory::SocketFactory
              (in_stack_fffffffffffff8f0,
               (string *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
               SUB81((ulong)in_stack_fffffffffffff8e0 >> 0x38,0));
  }
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3d3551);
  gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x3d3559);
  CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
  local_130._160_8_ = *(undefined8 *)(in_RDI + 0x260);
  gmlc::networking::establishConnection
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa18,in_stack_fffffffffffffa38);
  std::shared_ptr<gmlc::networking::TcpConnection>::operator=
            ((shared_ptr<gmlc::networking::TcpConnection> *)
             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffff888);
  std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x3d3602);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_130[0x2c] = (duration<long,std::ratio<1l,1000l>>)0x0;
  local_130[0x2d] = (duration<long,std::ratio<1l,1000l>>)0x0;
  local_130[0x2e] = (duration<long,std::ratio<1l,1000l>>)0x0;
  local_130[0x2f] = (duration<long,std::ratio<1l,1000l>>)0x0;
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffff898,in_stack_fffffffffffff894);
    if (bVar1) {
      local_1 = establishBrokerConnection::anon_class_16_2_8f9776d2::operator()
                          ((anon_class_16_2_8f9776d2 *)in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8ac);
      local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x1;
      local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
      local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
      local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
      goto LAB_003d4b0b;
    }
    if (local_130._44_4_ == 0) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff8a7._M_value,
                          CONCAT16(in_stack_fffffffffffff8a6,
                                   CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))),
                 (char *)in_stack_fffffffffffff898);
      message._M_str = in_stack_fffffffffffff910;
      message._M_len = in_stack_fffffffffffff908;
      CommsInterface::logWarning(in_stack_fffffffffffff900,message);
    }
    local_130._44_4_ = local_130._44_4_ + 1;
    if (*(int *)(in_RDI + 0x424) < (int)local_130._44_4_) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff8a7._M_value,
                          CONCAT16(in_stack_fffffffffffff8a6,
                                   CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))),
                 (char *)in_stack_fffffffffffff898);
      message_00._M_str = in_stack_fffffffffffff910;
      message_00._M_len = in_stack_fffffffffffff908;
      CommsInterface::logWarning(in_stack_fffffffffffff900,message_00);
      local_1 = establishBrokerConnection::anon_class_16_2_8f9776d2::operator()
                          ((anon_class_16_2_8f9776d2 *)in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8ac);
      local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x1;
      local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
      local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
      local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
      goto LAB_003d4b0b;
    }
    if ((int)local_130._44_4_ % 2 == 1) {
      std::this_thread::yield();
    }
    else {
      local_134 = 100;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_130,&local_134);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff8d0);
    }
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffff898,in_stack_fffffffffffff894);
    if (bVar1) {
      local_1 = establishBrokerConnection::anon_class_16_2_8f9776d2::operator()
                          ((anon_class_16_2_8f9776d2 *)in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8ac);
      local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x1;
      local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
      local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
      local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
      goto LAB_003d4b0b;
    }
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3d3a28);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x3d3a30);
    CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    local_248._216_8_ = *(undefined8 *)(in_RDI + 0x260);
    gmlc::networking::establishConnection
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18,in_stack_fffffffffffffa38);
    std::shared_ptr<gmlc::networking::TcpConnection>::operator=
              ((shared_ptr<gmlc::networking::TcpConnection> *)
               CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
               (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffff888);
    std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)0x3d3ad9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  }
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_fffffffffffff898,in_stack_fffffffffffff894);
  if (bVar1) {
    local_1 = establishBrokerConnection::anon_class_16_2_8f9776d2::operator()
                        ((anon_class_16_2_8f9776d2 *)in_stack_fffffffffffff8b0,
                         in_stack_fffffffffffff8ac);
    local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x1;
    local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
    local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
    local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
  }
  else {
    memset(local_248,0,8);
    local_250 = 200;
    local_251 = 0;
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffff898);
    __n = CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8);
    if ((0 < _Var3) && ((*(byte *)(in_RDI + 0x41b) & 1) != 0)) {
      local_251 = 1;
    }
    do {
      if (((local_251 ^ 0xff) & 1) == 0) {
        local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x0;
        local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
        local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
        local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
        break;
      }
      ActionMessage::ActionMessage(in_stack_fffffffffffff8b0,(action_t)(__n >> 0x20));
      _Var3 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffff898);
      local_30c = 0x12d;
      if (_Var3 < 1) {
        local_30c = 0x5af;
      }
      local_320 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      local_3c8._152_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      iVar2 = local_3c8._160_4_;
      string1._M_str = (char *)in_stack_fffffffffffff8b0;
      string1._M_len = __n;
      string2._M_str._0_4_ = in_stack_fffffffffffff8a0;
      string2._M_len = (size_t)in_stack_fffffffffffff898;
      string2._M_str._4_2_ = in_stack_fffffffffffff8a4;
      string2._M_str._6_1_ = in_stack_fffffffffffff8a6;
      string2._M_str._7_1_ = in_stack_fffffffffffff8a7._M_value;
      __n_00 = local_3c8._152_8_;
      ActionMessage::setStringData
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                 string1,string2);
      peVar4 = std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3d3f3e);
      ActionMessage::packetize_abi_cxx11_(in_stack_fffffffffffff8b8);
      gmlc::networking::TcpConnection::send(peVar4,(int)local_3c8 + 0x78,__buf,__n_00,iVar2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      paVar6 = &local_3c9;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8b0,__n,
                 (allocator_type *)
                 CONCAT17(in_stack_fffffffffffff8a7._M_value,
                          CONCAT16(in_stack_fffffffffffff8a6,
                                   CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))));
      std::allocator<char>::~allocator(&local_3c9);
      asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<asio::ip::tcp> *)0x3d41d8);
      std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3d41e5);
      this_00 = (CommsInterface *)local_3c8;
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x3d41fc);
      callback.this._7_1_ = in_stack_fffffffffffff8ef;
      callback.this._0_7_ = in_stack_fffffffffffff8e8;
      callback.rx = (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8f0;
      gmlc::networking::TcpConnection::
      async_receive<helics::tcp::TcpComms::establishBrokerConnection(std::shared_ptr<gmlc::networking::AsioContextManager>&,std::shared_ptr<gmlc::networking::TcpConnection>&)::__1>
                (in_stack_fffffffffffff8e0,
                 (void *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                 (size_t)in_stack_fffffffffffff8d0,callback);
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
      ::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9b8);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3d4280);
      if (bVar1) {
        std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                  ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3d4296);
        bVar1 = isProtocolCommand((ActionMessage *)
                                  CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
        if (!bVar1) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffff8a7._M_value,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(char *)in_stack_fffffffffffff898);
          message_02._M_str = in_stack_fffffffffffff910;
          message_02._M_len = (size_t)paVar6;
          CommsInterface::logWarning(this_00,message_02);
          goto LAB_003d4a80;
        }
        ppVar5 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                           ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                            0x3d42b8);
        if (((ppVar5->second).messageID == 0x5ab) &&
           (_Var3 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffff898), _Var3 < 1)) {
          in_stack_fffffffffffff8f0 = (SocketFactory *)(in_RDI + 0x4e8);
          std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                    ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3d4302);
          gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
          ::push<helics::ActionMessage&>(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
          local_251 = 1;
          local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x4;
          local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
        }
        else {
          ppVar5 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                             ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                              0x3d4394);
          if (((ppVar5->second).messageID == 0x130) &&
             (_Var3 = std::__atomic_base::operator_cast_to_int
                                ((__atomic_base<int> *)in_stack_fffffffffffff898), 0 < _Var3)) {
            local_251 = 1;
            local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x4;
            local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
            local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
            local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
          }
          else {
            ppVar5 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                               ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                                0x3d43dd);
            if ((ppVar5->second).messageID == 0x9db) {
              in_stack_fffffffffffff8ef =
                   establishBrokerConnection::anon_class_16_2_8f9776d2::operator()
                             ((anon_class_16_2_8f9776d2 *)in_stack_fffffffffffff8b0,
                              (ConnectionStatus)(__n >> 0x20));
              local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x1;
              local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
              local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
              local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
              local_1 = in_stack_fffffffffffff8ef;
            }
            else {
              ppVar5 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::
                       operator->((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                                  0x3d4428);
              if ((ppVar5->second).messageID == 0x14d) {
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(in_stack_fffffffffffff8a7._M_value,
                                    CONCAT16(in_stack_fffffffffffff8a6,
                                             CONCAT24(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0))),
                           (char *)in_stack_fffffffffffff898);
                message_01._M_str = in_stack_fffffffffffff910;
                message_01._M_len = (size_t)paVar6;
                iVar2 = local_4d8;
                CommsInterface::logMessage(this_00,message_01);
                peVar4 = std::
                         __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x3d4475);
                gmlc::networking::TcpConnection::close(peVar4,iVar2);
                std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                          ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3d448c
                          );
                in_stack_fffffffffffff8e0 =
                     (TcpConnection *)
                     ActionMessage::getString_abi_cxx11_
                               (in_stack_fffffffffffff898,in_stack_fffffffffffff894);
                gmlc::networking::extractInterfaceAndPort(in_stack_fffffffffffff998);
                *(undefined4 *)(in_RDI + 0x410) = local_4e0;
                in_stack_fffffffffffff8df =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890
                                                ),(char *)in_stack_fffffffffffff888);
                if (((in_stack_fffffffffffff8df ^ 0xff) & 1) != 0) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                             in_stack_fffffffffffff888);
                }
                std::
                __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x3d4536);
                in_stack_fffffffffffff8d0 =
                     (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                     gmlc::networking::AsioContextManager::getBaseContext
                               ((AsioContextManager *)0x3d453e);
                in_stack_fffffffffffff8c8 = (ActionMessage *)(in_RDI + 0x110);
                CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
                gmlc::networking::establishConnection
                          (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                           in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                           in_stack_fffffffffffffa38);
                std::shared_ptr<gmlc::networking::TcpConnection>::operator=
                          ((shared_ptr<gmlc::networking::TcpConnection> *)
                           CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                           (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffff888)
                ;
                std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                          ((shared_ptr<gmlc::networking::TcpConnection> *)0x3d45db);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
                local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x4;
                local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
                local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
                local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)0x3d48bd);
              }
              else {
                ppVar5 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::
                         operator->((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *
                                    )0x3d48e1);
                if ((ppVar5->second).messageID != 0xed3) {
                  __n = in_RDI + 0x4e8;
                  std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                            ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                             0x3d494b);
                  gmlc::containers::
                  BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
                  push<helics::ActionMessage&>(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
                  goto LAB_003d4a80;
                }
                local_5f4 = 2;
                std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                          (local_5f0,&local_5f4);
                std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                          ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff8d0);
                local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x4;
                local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
                local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
                local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
              }
            }
          }
        }
      }
      else {
        std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
                  ((duration<long,_std::ratio<1L,_1000L>_> *)
                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                   (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff888);
        in_stack_fffffffffffff8a7 =
             std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                       ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff8b8,
                        (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff8b0);
        local_609 = in_stack_fffffffffffff8a7._M_value;
        CLI::std::__cmp_cat::__unspec::__unspec(&local_60a,(__unspec *)0x0);
        bVar1 = std::operator>=(local_609);
        if (bVar1) {
          std::
          __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x3d4a0f);
          gmlc::networking::TcpConnection::cancel((TcpConnection *)0x3d4a17);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffff8a7._M_value,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(char *)in_stack_fffffffffffff898);
          message_03._M_str = in_stack_fffffffffffff910;
          message_03._M_len = (size_t)paVar6;
          CommsInterface::logError(this_00,message_03);
          in_stack_fffffffffffff8a6 =
               establishBrokerConnection::anon_class_16_2_8f9776d2::operator()
                         ((anon_class_16_2_8f9776d2 *)in_stack_fffffffffffff8b0,
                          (ConnectionStatus)(__n >> 0x20));
          local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x1;
          local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_1 = in_stack_fffffffffffff8a6;
        }
        else {
LAB_003d4a80:
          local_130[0x28] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x29] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x2a] = (duration<long,std::ratio<1l,1000l>>)0x0;
          local_130[0x2b] = (duration<long,std::ratio<1l,1000l>>)0x0;
        }
      }
      std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::~optional
                ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3d4a98);
      CLI::std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff8a7._M_value,
                          CONCAT16(in_stack_fffffffffffff8a6,
                                   CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))));
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      in_stack_fffffffffffff8a0 = local_130._40_4_;
    } while ((local_130._40_4_ == 0) || (local_130._40_4_ == 4));
  }
LAB_003d4b0b:
  gmlc::networking::SocketFactory::~SocketFactory((SocketFactory *)0x3d4b18);
  if (local_130._40_4_ == 0) {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool TcpComms::establishBrokerConnection(
    std::shared_ptr<gmlc::networking::AsioContextManager>& ioctx,
    std::shared_ptr<TcpConnection>& brokerConnection)
{
    // lambda function that does the proper termination
    auto terminate = [&, this](ConnectionStatus status) -> bool {
        if (brokerConnection) {
            brokerConnection->close();
            brokerConnection = nullptr;
        }
        setTxStatus(status);
        return false;
    };

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    try {
        auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                              gmlc::networking::SocketFactory();
        try {
            brokerConnection = gmlc::networking::establishConnection(sf,
                                                                     ioctx->getBaseContext(),
                                                                     brokerTargetAddress,
                                                                     std::to_string(brokerPort),
                                                                     connectionTimeout);
        }
        catch (std::system_error& e) {
            logWarning(std::string("network error (retrying):: ") + e.what());
            brokerConnection = nullptr;
        }
        int retries = 0;
        while (!brokerConnection) {
            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            if (retries == 0) {
                logWarning("initial connection to broker timed out ");
            }
            ++retries;
            if (retries > maxRetries) {
                logWarning(
                    "initial connection to broker timed out exceeding max number of retries ");
                return terminate(ConnectionStatus::ERRORED);
            }
            if (retries % 2 == 1) {
                std::this_thread::yield();
            } else {
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }

            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         connectionTimeout);
            }
            catch (std::system_error& e) {
                logWarning(std::string("network error (retry #") + std::to_string(retries) +
                           "):: " + e.what());
                brokerConnection = nullptr;
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            return terminate(ConnectionStatus::TERMINATED);
        }
        // monitor the total waiting time before connections
        std::chrono::milliseconds cumulativeSleep{0};
        const std::chrono::milliseconds popTimeout{200};

        bool connectionEstablished{false};
        if (PortNumber > 0 && NetworkCommsInterface::noAckConnection) {
            connectionEstablished = true;
        }
        while (!connectionEstablished) {
            ActionMessage m(CMD_PROTOCOL_PRIORITY);
            m.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;

            m.setStringData(brokerName, brokerInitString);
            try {
                brokerConnection->send(m.packetize());
            }
            catch (const std::system_error& error) {
                logError(std::string("error in initial send to broker ") + error.what());
                return terminate(ConnectionStatus::ERRORED);
            }
            std::vector<char> rx(512);
            tcp::endpoint brk;
            brokerConnection->async_receive(
                rx.data(), 128, [this, &rx](const std::error_code& error, size_t bytes) {
                    if (!error) {
                        txReceive(rx.data(), bytes, std::string());
                    } else {
                        if (error != asio::error::operation_aborted) {
                            txReceive(rx.data(), bytes, error.message());
                        }
                    }
                });
            auto mess = txQueue.pop(popTimeout);
            if (mess) {
                if (isProtocolCommand(mess->second)) {
                    if (mess->second.messageID == PORT_DEFINITIONS) {
                        if (PortNumber <= 0) {
                            rxMessageQueue.push(mess->second);
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == CONNECTION_ACK) {
                        if (PortNumber > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == DISCONNECT) {
                        return terminate(ConnectionStatus::TERMINATED);
                    }
                    if (mess->second.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        brokerConnection->close();

                        auto brkprt =
                            gmlc::networking::extractInterfaceAndPort(mess->second.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        try {
                            brokerConnection =
                                gmlc::networking::establishConnection(sf,
                                                                      ioctx->getBaseContext(),
                                                                      brokerTargetAddress,
                                                                      std::to_string(brokerPort),
                                                                      connectionTimeout);
                        }
                        catch (const std::exception& e) {
                            brokerConnection = nullptr;
                            logError(std::string(" unable to create broker connection to ") +
                                     brokerTargetAddress + "::" + e.what());
                            return terminate(ConnectionStatus::ERRORED);
                        }
                        continue;
                    }
                    if (mess->second.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                        continue;
                    }
                    rxMessageQueue.push(mess->second);
                } else {
                    logWarning("unexpected message received in transmit queue");
                }
            } else {
                cumulativeSleep += popTimeout;
                if (cumulativeSleep >= connectionTimeout) {
                    brokerConnection->cancel();
                    logError("port number query to broker timed out");
                    return terminate(ConnectionStatus::ERRORED);
                }
            }
        }
    }
    catch (std::exception& e) {
        logError(std::string("error connecting with Broker") + e.what());
        return terminate(ConnectionStatus::ERRORED);
    }
    return true;
}